

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

bool __thiscall duckdb::hugeint_t::operator!(hugeint_t *this)

{
  hugeint_t local_20;
  
  hugeint_t(&local_20,0);
  return this->upper == local_20.upper && this->lower == local_20.lower;
}

Assistant:

bool hugeint_t::operator!() const {
	return *this == 0;
}